

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

QModelIndex * __thiscall
QTableView::moveCursor
          (QModelIndex *__return_storage_ptr__,QTableView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  QPersistentModelIndex *this_00;
  QTableViewPrivate *this_01;
  QWidgetData *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Representation RVar9;
  Representation RVar10;
  int column;
  int iVar11;
  uint uVar12;
  Representation RVar13;
  long lVar14;
  int extraout_var;
  int extraout_var_00;
  Representation RVar15;
  QPoint QVar16;
  QPoint QVar17;
  ulong uVar18;
  bool bVar19;
  uint uVar20;
  QAbstractItemModel *pQVar21;
  SearchDirection searchDirection;
  ulong uVar22;
  ulong uVar23;
  QSpanCollection *pQVar24;
  long in_FS_OFFSET;
  bool bVar25;
  QModelIndex local_b0;
  QModelIndex local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar21 = (this_01->super_QAbstractItemViewPrivate).model;
  this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,this_00);
  uVar6 = (**(code **)(*(long *)pQVar21 + 0x78))(pQVar21,&local_98);
  do {
    uVar12 = uVar6;
    uVar6 = uVar12 - 1;
    if ((int)uVar12 < 1) break;
    iVar7 = QTableViewPrivate::logicalRow(this_01,uVar6);
    bVar2 = isRowHidden(this,iVar7);
  } while (bVar2);
  pQVar21 = (this_01->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_98,this_00);
  uVar8 = (**(code **)(*(long *)pQVar21 + 0x80))(pQVar21,&local_98);
  do {
    uVar20 = uVar8;
    if ((int)uVar20 < 1) break;
    iVar7 = QTableViewPrivate::logicalColumn(this_01,uVar20 - 1);
    bVar2 = isColumnHidden(this,iVar7);
    uVar8 = uVar20 - 1;
  } while (bVar2);
  uVar8 = uVar20 - 1;
  if ((uVar6 == 0xffffffff) || (uVar20 == 0)) goto LAB_0052b45e;
  local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex(&local_98,(QAbstractItemView *)this);
  if ((local_98.r < 0) ||
     (((long)local_98._0_8_ < 0 || (local_98.m.ptr == (QAbstractItemModel *)0x0)))) {
    iVar7 = -1;
    uVar23 = 0;
    uVar18 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar18 = uVar23;
    }
    while (iVar11 = (int)uVar23, uVar22 = uVar18, (int)uVar18 != iVar11) {
      column = QTableViewPrivate::logicalColumn(this_01,iVar11);
      bVar2 = isColumnHidden(this,column);
      uVar22 = uVar23;
      if (!bVar2) break;
      uVar23 = (ulong)(iVar11 + 1);
    }
    QVar17 = (QPoint)(uVar22 | 0xffffffff00000000);
    do {
      QVar17 = (QPoint)((long)QVar17 + 0x100000000);
      iVar7 = iVar7 + 1;
      iVar11 = QTableViewPrivate::logicalRow(this_01,iVar7);
      bVar2 = isRowHidden(this,iVar11);
      if (!bVar2) break;
    } while (iVar7 < (int)uVar6);
    this_01->visualCursor = QVar17;
    pQVar21 = (this_01->super_QAbstractItemViewPrivate).model;
    iVar11 = QTableViewPrivate::logicalRow(this_01,iVar7);
    iVar7 = QTableViewPrivate::logicalColumn(this_01,(int)uVar22);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    lVar14 = *(long *)pQVar21;
    goto LAB_0052b538;
  }
  RVar9.m_i = QTableViewPrivate::visualColumn(this_01,local_98.c);
  RVar10.m_i = QTableViewPrivate::visualRow(this_01,local_98.r);
  RVar15.m_i = RVar9.m_i;
  RVar13.m_i = RVar10.m_i;
  if ((RVar9.m_i != (this_01->visualCursor).xp.m_i) ||
     (RVar10.m_i != (this_01->visualCursor).yp.m_i)) {
    if ((QSpanCollection *)
        (this_01->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next == &this_01->spans) {
      QVar17.yp.m_i = RVar10.m_i;
      QVar17.xp.m_i = RVar9.m_i;
      this_01->visualCursor = QVar17;
    }
    else {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_58.m.ptr._0_4_ = 0xaaaaaaaa;
      QTableViewPrivate::span((Span *)&local_58,this_01,local_98.r,local_98.c);
      RVar13.m_i = (this_01->visualCursor).yp.m_i;
      if ((local_58.r <= RVar13.m_i) && (RVar13.m_i <= (int)local_58.i)) {
        RVar15.m_i = (this_01->visualCursor).xp.m_i;
        if ((local_58.c <= RVar15.m_i) && (RVar15.m_i <= local_58.i._4_4_)) goto LAB_0052b584;
      }
      QVar16.yp.m_i = RVar10.m_i;
      QVar16.xp.m_i = RVar9.m_i;
      this_01->visualCursor = QVar16;
      RVar15.m_i = RVar9.m_i;
      RVar13.m_i = RVar10.m_i;
    }
  }
LAB_0052b584:
  if ((int)uVar12 <= RVar13.m_i) {
    RVar13.m_i = uVar6;
  }
  if ((int)uVar20 <= RVar15.m_i) {
    RVar15.m_i = uVar8;
  }
  uVar18 = (ulong)(uint)RVar15.m_i;
  bVar2 = QWidget::isRightToLeft((QWidget *)this);
  if (!bVar2) {
    switch(cursorAction) {
    case MoveUp:
      goto switchD_0052b5c6_caseD_0;
    case MoveDown:
      goto switchD_0052b5c6_caseD_1;
    case MoveLeft:
    case MovePrevious:
      goto switchD_0052b5c6_caseD_9;
    case MoveRight:
    case MoveNext:
      goto switchD_0052b5c6_caseD_8;
    case MoveHome:
      goto switchD_0052b5c6_caseD_4;
    case MoveEnd:
      goto switchD_0052b5c6_caseD_5;
    case MovePageUp:
      goto switchD_0052b5c6_caseD_6;
    case MovePageDown:
      goto switchD_0052b5c6_caseD_7;
    }
    goto switchD_0052b5c6_default;
  }
  bVar2 = true;
  switch(cursorAction) {
  case MoveUp:
switchD_0052b5c6_caseD_0:
    iVar7 = QTableViewPrivate::logicalRow(this_01,RVar13.m_i);
    iVar11 = QTableViewPrivate::logicalColumn(this_01,RVar15.m_i);
    uVar6 = RVar13.m_i;
    if ((iVar7 != -1) &&
       ((QSpanCollection *)
        (this_01->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != &this_01->spans)) {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_58.m.ptr._0_4_ = 0xaaaaaaaa;
      QTableViewPrivate::span((Span *)&local_58,this_01,iVar7,iVar11);
      if ((1 < (local_58.i._4_4_ - local_58.c) + 1) || (1 < ((int)local_58.i - local_58.r) + 1)) {
        uVar6 = QTableViewPrivate::visualRow(this_01,local_58.r);
      }
    }
    do {
      uVar12 = uVar6;
      if ((int)uVar12 < 0) goto LAB_0052bd18;
      uVar6 = uVar12 - 1;
      iVar7 = QTableViewPrivate::logicalRow(this_01,uVar6);
      iVar11 = QTableViewPrivate::logicalColumn(this_01,RVar15.m_i);
    } while ((iVar7 != -1) &&
            ((bVar2 = isRowHidden(this,iVar7), bVar2 ||
             (bVar2 = QTableViewPrivate::isCellEnabled(this_01,iVar7,iVar11), !bVar2))));
    uVar12 = uVar12 - 1;
LAB_0052bd18:
    if (-1 < (int)uVar12) {
      RVar13.m_i = uVar12;
    }
    break;
  case MoveDown:
switchD_0052b5c6_caseD_1:
    pQVar24 = &this_01->spans;
    uVar6 = RVar13.m_i;
    if ((QSpanCollection *)
        (this_01->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != pQVar24) {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_58.m.ptr._0_4_ = 0xaaaaaaaa;
      QTableViewPrivate::span((Span *)&local_58,this_01,local_98.r,local_98.c);
      iVar7 = QTableViewPrivate::rowSpanEndLogical
                        (this_01,local_58.r,((int)local_58.i - local_58.r) + 1);
      uVar6 = QTableViewPrivate::visualRow(this_01,iVar7);
    }
    iVar7 = QTableViewPrivate::logicalRow(this_01,uVar6);
    iVar11 = QTableViewPrivate::logicalColumn(this_01,RVar15.m_i);
    if ((iVar7 != -1) &&
       ((QSpanCollection *)
        (pQVar24->spans).
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != pQVar24)) {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_58.m.ptr._0_4_ = 0xaaaaaaaa;
      QTableViewPrivate::span((Span *)&local_58,this_01,iVar7,iVar11);
      if ((1 < (local_58.i._4_4_ - local_58.c) + 1) || (1 < ((int)local_58.i - local_58.r) + 1)) {
        iVar7 = QTableViewPrivate::rowSpanEndLogical
                          (this_01,local_58.r,((int)local_58.i - local_58.r) + 1);
        uVar6 = QTableViewPrivate::visualRow(this_01,iVar7);
      }
    }
    do {
      uVar8 = uVar6;
      if ((int)uVar12 <= (int)uVar8) goto LAB_0052bfc7;
      uVar6 = uVar8 + 1;
      iVar7 = QTableViewPrivate::logicalRow(this_01,uVar6);
      iVar11 = QTableViewPrivate::logicalColumn(this_01,RVar15.m_i);
    } while ((iVar7 != -1) &&
            ((bVar2 = isRowHidden(this,iVar7), bVar2 ||
             (bVar2 = QTableViewPrivate::isCellEnabled(this_01,iVar7,iVar11), !bVar2))));
    uVar8 = uVar8 + 1;
LAB_0052bfc7:
    if ((int)uVar8 < (int)uVar12) {
      RVar13.m_i = uVar8;
    }
    break;
  case MoveHome:
switchD_0052b5c6_caseD_4:
    uVar12 = QTableViewPrivate::nextActiveVisualColumn(this_01,RVar13.m_i,0,uVar8,Increasing);
    uVar18 = (ulong)uVar12;
    if (((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) != 0) {
      uVar20 = 0;
      searchDirection = Increasing;
      uVar8 = uVar6;
LAB_0052bd35:
      RVar13.m_i = QTableViewPrivate::nextActiveVisualRow
                             (this_01,uVar20,uVar12,uVar8,searchDirection);
    }
    break;
  case MoveEnd:
switchD_0052b5c6_caseD_5:
    uVar12 = QTableViewPrivate::nextActiveVisualColumn(this_01,RVar13.m_i,uVar8,-1,Decreasing);
    uVar18 = (ulong)uVar12;
    if (((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) != 0) {
      searchDirection = Decreasing;
      uVar8 = 0xffffffff;
      uVar20 = uVar6;
      goto LAB_0052bd35;
    }
    break;
  case MovePageUp:
switchD_0052b5c6_caseD_6:
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1e0))(this,&local_98);
    pQVar1 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar7 = rowAt(this,~(pQVar1->crect).y2.m_i + extraout_var_00 + (pQVar1->crect).y1.m_i);
    if (iVar7 == -1) {
      iVar7 = 0;
    }
    else {
      iVar7 = QTableViewPrivate::visualRow(this_01,iVar7);
    }
    iVar7 = QTableViewPrivate::nextActiveVisualRow(this_01,iVar7,local_98.c,uVar6,Increasing);
    iVar11 = QTableViewPrivate::logicalRow(this_01,iVar7);
    pQVar21 = (this_01->super_QAbstractItemViewPrivate).model;
    iVar7 = local_98.c;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    lVar14 = *(long *)pQVar21;
    goto LAB_0052b538;
  case MovePageDown:
switchD_0052b5c6_caseD_7:
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1e0))(this,&local_98);
    pQVar1 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar7 = rowAt(this,((extraout_var + (pQVar1->crect).y2.m_i) - (pQVar1->crect).y1.m_i) + 1);
    if (iVar7 != -1) {
      uVar6 = QTableViewPrivate::visualRow(this_01,iVar7);
    }
    iVar7 = QTableViewPrivate::nextActiveVisualRow(this_01,uVar6,local_98.c,-1,Decreasing);
    iVar11 = QTableViewPrivate::logicalRow(this_01,iVar7);
    pQVar21 = (this_01->super_QAbstractItemViewPrivate).model;
    iVar7 = local_98.c;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    lVar14 = *(long *)pQVar21;
LAB_0052b538:
    (**(code **)(lVar14 + 0x60))(__return_storage_ptr__,pQVar21,iVar11,iVar7,&local_58);
    goto LAB_0052b53e;
  case MoveNext:
switchD_0052b5c6_caseD_8:
    bVar2 = cursorAction == MoveRight;
  case MoveLeft:
    bVar3 = true;
    bVar19 = false;
    uVar12 = RVar13.m_i;
    do {
      iVar7 = QTableViewPrivate::logicalRow(this_01,uVar12);
      iVar11 = QTableViewPrivate::logicalColumn(this_01,(int)uVar18);
      if ((bVar3) && (iVar11 != -1)) {
        if ((QSpanCollection *)
            (this_01->spans).spans.
            super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
            _M_impl._M_node.super__List_node_base._M_next == &this_01->spans) {
          bVar3 = true;
        }
        else {
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          local_58.m.ptr._0_4_ = 0xaaaaaaaa;
          QTableViewPrivate::span((Span *)&local_58,this_01,iVar7,iVar11);
          iVar7 = (local_58.i._4_4_ - local_58.c) + 1;
          if (iVar7 < 2) {
            if (1 < ((int)local_58.i - local_58.r) + 1) goto LAB_0052b891;
          }
          else {
LAB_0052b891:
            iVar7 = QTableViewPrivate::columnSpanEndLogical(this_01,local_58.c,iVar7);
            uVar8 = QTableViewPrivate::visualColumn(this_01,iVar7);
            uVar18 = (ulong)uVar8;
          }
          bVar3 = false;
        }
      }
      while (uVar8 = (uint)uVar18, (int)uVar8 < (int)uVar20) {
        iVar7 = QTableViewPrivate::logicalRow(this_01,uVar12);
        iVar11 = QTableViewPrivate::logicalColumn(this_01,uVar8 + 1);
        bVar4 = false;
        if ((iVar7 == -1) || (iVar11 == -1)) {
LAB_0052b965:
          uVar8 = uVar8 + 1;
          goto LAB_0052b96f;
        }
        bVar4 = isRowHidden(this,iVar7);
        if ((!bVar4) &&
           ((bVar4 = isColumnHidden(this,iVar11), !bVar4 &&
            (bVar4 = QTableViewPrivate::isCellEnabled(this_01,iVar7,iVar11), bVar4)))) {
          bVar4 = false;
          goto LAB_0052b965;
        }
        if (bVar19) {
          bVar4 = true;
          if (((int)uVar12 < RVar13.m_i) || (RVar13.m_i == uVar12 && (int)uVar8 < RVar15.m_i))
          goto LAB_0052b965;
        }
        uVar18 = (ulong)(uVar8 + 1);
      }
      bVar4 = false;
LAB_0052b96f:
      if ((int)uVar8 < (int)uVar20 || bVar2) goto LAB_0052b9b3;
      bVar25 = uVar12 == uVar6;
      uVar12 = uVar12 + 1;
      if (bVar25) {
        uVar12 = 0;
      }
      bVar19 = (bool)(bVar19 | bVar25);
      uVar18 = 0xffffffff;
    } while (!bVar4);
    uVar8 = 0xffffffff;
LAB_0052b9b3:
    if ((int)uVar8 < (int)uVar20) {
      RVar15.m_i = uVar8;
    }
    uVar18 = (ulong)(uint)RVar15.m_i;
    RVar13.m_i = uVar12;
    break;
  case MovePrevious:
switchD_0052b5c6_caseD_9:
    bVar2 = cursorAction == MoveLeft;
  case MoveRight:
    bVar3 = true;
    bVar19 = false;
    uVar12 = RVar13.m_i;
    do {
      iVar7 = QTableViewPrivate::logicalRow(this_01,uVar12);
      iVar11 = QTableViewPrivate::logicalColumn(this_01,(int)uVar18);
      if ((bVar3) && (iVar11 != -1)) {
        if ((QSpanCollection *)
            (this_01->spans).spans.
            super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
            _M_impl._M_node.super__List_node_base._M_next == &this_01->spans) {
          bVar3 = true;
        }
        else {
          local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          local_58.m.ptr._0_4_ = 0xaaaaaaaa;
          QTableViewPrivate::span((Span *)&local_58,this_01,iVar7,iVar11);
          if ((local_58.i._4_4_ - local_58.c) + 1 < 2) {
            if (1 < ((int)local_58.i - local_58.r) + 1) goto LAB_0052b6ac;
          }
          else {
LAB_0052b6ac:
            uVar8 = QTableViewPrivate::visualColumn(this_01,local_58.c);
            uVar18 = (ulong)uVar8;
          }
          bVar3 = false;
        }
      }
      while (uVar8 = (uint)uVar18, -1 < (int)uVar8) {
        iVar7 = QTableViewPrivate::logicalRow(this_01,uVar12);
        iVar11 = QTableViewPrivate::logicalColumn(this_01,uVar8 - 1);
        bVar4 = false;
        if ((iVar7 == -1) || (iVar11 == -1)) {
LAB_0052b774:
          uVar8 = uVar8 - 1;
          goto LAB_0052b77e;
        }
        bVar4 = isRowHidden(this,iVar7);
        if ((!bVar4) &&
           ((bVar4 = isColumnHidden(this,iVar11), !bVar4 &&
            (bVar4 = QTableViewPrivate::isCellEnabled(this_01,iVar7,iVar11), bVar4)))) {
          bVar4 = false;
          goto LAB_0052b774;
        }
        if (bVar19) {
          bVar4 = true;
          if ((RVar13.m_i < (int)uVar12) || (RVar13.m_i == uVar12 && RVar15.m_i < (int)uVar8))
          goto LAB_0052b774;
        }
        uVar18 = (ulong)(uVar8 - 1);
      }
      bVar4 = false;
LAB_0052b77e:
      if (-1 < (int)uVar8 || bVar2) break;
      bVar25 = uVar12 == 0;
      uVar12 = uVar12 - 1;
      if (bVar25) {
        uVar12 = uVar6;
      }
      bVar19 = (bool)(bVar19 | bVar25);
      uVar18 = (ulong)uVar20;
      uVar8 = uVar20;
    } while (!bVar4);
    if (-1 < (int)uVar8) {
      RVar15.m_i = uVar8;
    }
    uVar18 = (ulong)(uint)RVar15.m_i;
    RVar13.m_i = uVar12;
  }
switchD_0052b5c6_default:
  this_01->visualCursor = (QPoint)(uVar18 | (ulong)(uint)RVar13.m_i << 0x20);
  iVar7 = QTableViewPrivate::logicalRow(this_01,RVar13.m_i);
  uVar6 = QTableViewPrivate::logicalColumn(this_01,(int)uVar18);
  pQVar21 = (this_01->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
  cVar5 = QAbstractItemModel::hasIndex((int)pQVar21,iVar7,(QModelIndex *)(ulong)uVar6);
  if (cVar5 != '\0') {
    local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar21 = (this_01->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_b0,this_00);
    (**(code **)(*(long *)pQVar21 + 0x60))(&local_58,pQVar21,iVar7,uVar6,&local_b0);
    bVar2 = QTableViewPrivate::isRowHidden(this_01,iVar7);
    if (((!bVar2) && (bVar2 = QTableViewPrivate::isColumnHidden(this_01,uVar6), !bVar2)) &&
       (pQVar21 = (this_01->super_QAbstractItemViewPrivate).model,
       uVar18 = (**(code **)(*(long *)pQVar21 + 0x138))(pQVar21,&local_58), (uVar18 & 0x20) != 0)) {
      if ((QSpanCollection *)
          (this_01->spans).spans.
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node.super__List_node_base._M_next != &this_01->spans) {
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        uStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_68._0_1_ = true;
        local_68._1_3_ = 0xaaaaaa;
        QTableViewPrivate::span((Span *)&local_78,this_01,local_58.r,local_58.c);
        if ((1 < (uStack_70._4_4_ - local_78._4_4_) + 1) ||
           (1 < ((int)uStack_70 - (int)local_78) + 1)) {
          (**(code **)(*(long *)(this_01->super_QAbstractItemViewPrivate).model + 0x70))(&local_b0);
          local_58.m.ptr = local_b0.m.ptr;
          local_58.r = local_b0.r;
          local_58.c = local_b0.c;
          local_58.i = local_b0.i;
        }
      }
      (__return_storage_ptr__->m).ptr = local_58.m.ptr;
      __return_storage_ptr__->r = local_58.r;
      __return_storage_ptr__->c = local_58.c;
      *(int *)&__return_storage_ptr__->i = (int)local_58.i;
      *(int *)((long)&__return_storage_ptr__->i + 4) = local_58.i._4_4_;
      goto LAB_0052b53e;
    }
  }
LAB_0052b45e:
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
LAB_0052b53e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QTableView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QTableView);
    Q_UNUSED(modifiers);

    int bottom = d->model->rowCount(d->root) - 1;
    // make sure that bottom is the bottommost *visible* row
    while (bottom >= 0 && isRowHidden(d->logicalRow(bottom)))
        --bottom;

    int right = d->model->columnCount(d->root) - 1;

    while (right >= 0 && isColumnHidden(d->logicalColumn(right)))
        --right;

    if (bottom == -1 || right == -1)
        return QModelIndex(); // model is empty

    QModelIndex current = currentIndex();

    if (!current.isValid()) {
        int row = 0;
        int column = 0;
        while (column < right && isColumnHidden(d->logicalColumn(column)))
            ++column;
        while (isRowHidden(d->logicalRow(row)) && row < bottom)
            ++row;
        d->visualCursor = QPoint(column, row);
        return d->model->index(d->logicalRow(row), d->logicalColumn(column), d->root);
    }

    // Update visual cursor if current index has changed.
    QPoint visualCurrent(d->visualColumn(current.column()), d->visualRow(current.row()));
    if (visualCurrent != d->visualCursor) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(current.row(), current.column());
            if (span.top() > d->visualCursor.y() || d->visualCursor.y() > span.bottom()
                || span.left() > d->visualCursor.x() || d->visualCursor.x() > span.right())
                d->visualCursor = visualCurrent;
        } else {
            d->visualCursor = visualCurrent;
        }
    }

    int visualRow = d->visualCursor.y();
    if (visualRow > bottom)
        visualRow = bottom;
    Q_ASSERT(visualRow != -1);
    int visualColumn = d->visualCursor.x();
    if (visualColumn > right)
        visualColumn = right;
    Q_ASSERT(visualColumn != -1);

    if (isRightToLeft()) {
        if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
        else if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
    }

    switch (cursorAction) {
    case MoveUp: {
        int originalRow = visualRow;
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && visualRow == 0)
            visualRow = d->visualRow(model()->rowCount() - 1) + 1;
            // FIXME? visualRow = bottom + 1;
#endif
        int r = d->logicalRow(visualRow);
        int c = d->logicalColumn(visualColumn);
        if (r != -1 && d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            if (span.width() > 1 || span.height() > 1)
                visualRow = d->visualRow(span.top());
        }
        while (visualRow >= 0) {
            --visualRow;
            r = d->logicalRow(visualRow);
            c = d->logicalColumn(visualColumn);
            if (r == -1 || (!isRowHidden(r) && d->isCellEnabled(r, c)))
                break;
        }
        if (visualRow < 0)
            visualRow = originalRow;
        break;
    }
    case MoveDown: {
        int originalRow = visualRow;
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(current.row(), current.column());
            visualRow = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
        }
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && visualRow >= bottom)
            visualRow = -1;
#endif
        int r = d->logicalRow(visualRow);
        int c = d->logicalColumn(visualColumn);
        if (r != -1 && d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            if (span.width() > 1 || span.height() > 1)
                visualRow = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
        }
        while (visualRow <= bottom) {
            ++visualRow;
            r = d->logicalRow(visualRow);
            c = d->logicalColumn(visualColumn);
            if (r == -1 || (!isRowHidden(r) && d->isCellEnabled(r, c)))
                break;
        }
        if (visualRow > bottom)
            visualRow = originalRow;
        break;
    }
    case MovePrevious:
    case MoveLeft: {
        int originalRow = visualRow;
        int originalColumn = visualColumn;
        bool firstTime = true;
        bool looped = false;
        bool wrapped = false;
        do {
            int r = d->logicalRow(visualRow);
            int c = d->logicalColumn(visualColumn);
            if (firstTime && c != -1 && d->hasSpans()) {
                firstTime = false;
                QSpanCollection::Span span = d->span(r, c);
                if (span.width() > 1 || span.height() > 1)
                    visualColumn = d->visualColumn(span.left());
            }
            while (visualColumn >= 0) {
                --visualColumn;
                r = d->logicalRow(visualRow);
                c = d->logicalColumn(visualColumn);
                if (r == -1 || c == -1 || (!isRowHidden(r) && !isColumnHidden(c) && d->isCellEnabled(r, c)))
                    break;
                if (wrapped && (originalRow < visualRow || (originalRow == visualRow && originalColumn <= visualColumn))) {
                    looped = true;
                    break;
                }
            }
            if (cursorAction == MoveLeft || visualColumn >= 0)
                break;
            visualColumn = right + 1;
            if (visualRow == 0) {
                wrapped = true;
                visualRow = bottom;
            } else {
                --visualRow;
            }
        } while (!looped);
        if (visualColumn < 0)
            visualColumn = originalColumn;
        break;
    }
    case MoveNext:
    case MoveRight: {
        int originalRow = visualRow;
        int originalColumn = visualColumn;
        bool firstTime = true;
        bool looped = false;
        bool wrapped = false;
        do {
            int r = d->logicalRow(visualRow);
            int c = d->logicalColumn(visualColumn);
            if (firstTime && c != -1 && d->hasSpans()) {
                firstTime = false;
                QSpanCollection::Span span = d->span(r, c);
                if (span.width() > 1 || span.height() > 1)
                    visualColumn = d->visualColumn(d->columnSpanEndLogical(span.left(), span.width()));
            }
            while (visualColumn <= right) {
                ++visualColumn;
                r = d->logicalRow(visualRow);
                c = d->logicalColumn(visualColumn);
                if (r == -1 || c == -1 || (!isRowHidden(r) && !isColumnHidden(c) && d->isCellEnabled(r, c)))
                    break;
                if (wrapped && (originalRow > visualRow || (originalRow == visualRow && originalColumn >= visualColumn))) {
                    looped = true;
                    break;
                }
            }
            if (cursorAction == MoveRight || visualColumn <= right)
                break;
            visualColumn = -1;
            if (visualRow == bottom) {
                wrapped = true;
                visualRow = 0;
            } else {
                ++visualRow;
            }
        } while (!looped);
        if (visualColumn > right)
            visualColumn = originalColumn;
        break;
    }
    case MoveHome:
        visualColumn = d->nextActiveVisualColumn(visualRow, 0, right,
                                                 QTableViewPrivate::SearchDirection::Increasing);
        if (modifiers & Qt::ControlModifier)
            visualRow = d->nextActiveVisualRow(0, visualColumn, bottom,
                                               QTableViewPrivate::SearchDirection::Increasing);
        break;
    case MoveEnd:
        visualColumn = d->nextActiveVisualColumn(visualRow, right, -1,
                                                 QTableViewPrivate::SearchDirection::Decreasing);
        if (modifiers & Qt::ControlModifier)
            visualRow = d->nextActiveVisualRow(bottom, visualColumn, -1,
                                               QTableViewPrivate::SearchDirection::Decreasing);
        break;
    case MovePageUp: {
        int newLogicalRow = rowAt(visualRect(current).bottom() - d->viewport->height());
        int visualRow = (newLogicalRow == -1 ? 0 : d->visualRow(newLogicalRow));
        visualRow = d->nextActiveVisualRow(visualRow, current.column(), bottom,
                                           QTableViewPrivate::SearchDirection::Increasing);
        newLogicalRow = d->logicalRow(visualRow);
        return d->model->index(newLogicalRow, current.column(), d->root);
    }
    case MovePageDown: {
        int newLogicalRow = rowAt(visualRect(current).top() + d->viewport->height());
        int visualRow = (newLogicalRow == -1 ? bottom : d->visualRow(newLogicalRow));
        visualRow = d->nextActiveVisualRow(visualRow, current.column(), -1,
                                           QTableViewPrivate::SearchDirection::Decreasing);
        newLogicalRow = d->logicalRow(visualRow);
        return d->model->index(newLogicalRow, current.column(), d->root);
    }}

    d->visualCursor = QPoint(visualColumn, visualRow);
    int logicalRow = d->logicalRow(visualRow);
    int logicalColumn = d->logicalColumn(visualColumn);
    if (!d->model->hasIndex(logicalRow, logicalColumn, d->root))
        return QModelIndex();

    QModelIndex result = d->model->index(logicalRow, logicalColumn, d->root);
    if (!d->isRowHidden(logicalRow) && !d->isColumnHidden(logicalColumn) && d->isIndexEnabled(result)) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(result.row(), result.column());
            if (span.width() > 1 || span.height() > 1) {
                result = d->model->sibling(span.top(), span.left(), result);
            }
        }
        return result;
    }

    return QModelIndex();
}